

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_deserialize(sqlite3 *db,char *zSchema,uchar *pData,sqlite3_int64 szDb,
                       sqlite3_int64 szBuf,uint mFlags)

{
  long lVar1;
  MemStore *pMVar2;
  int iVar3;
  char *zSchema_00;
  MemFile *pMVar4;
  sqlite3_int64 in_RCX;
  uchar *in_RDX;
  long in_RSI;
  long in_RDI;
  sqlite3_stmt *in_R8;
  uint in_R9D;
  long in_FS_OFFSET;
  MemStore *pStore;
  int iDb;
  int rc;
  char *zSql;
  MemFile *p;
  sqlite3_stmt *pStmt;
  char **in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  sqlite3 *db_00;
  sqlite3 *db_01;
  undefined4 in_stack_ffffffffffffffc0;
  uchar *local_28;
  long local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_01 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  uVar6 = 0xaaaaaaaa;
  uVar5 = 0xaaaaaaaa;
  sqlite3_mutex_enter((sqlite3_mutex *)0x13ae99);
  local_20 = in_RSI;
  if (in_RSI == 0) {
    local_20 = **(long **)(in_RDI + 0x20);
  }
  iVar3 = sqlite3FindDbName(db_00,(char *)CONCAT44(uVar6,uVar5));
  local_28 = in_RDX;
  if ((iVar3 < 2) && (iVar3 != 0)) {
    iVar7 = 1;
  }
  else {
    zSchema_00 = sqlite3_mprintf("ATTACH x AS %Q",local_20);
    if (zSchema_00 == (char *)0x0) {
      iVar7 = 7;
    }
    else {
      iVar7 = sqlite3_prepare_v2((sqlite3 *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),(char *)db_01
                                 ,(int)((ulong)zSchema_00 >> 0x20),
                                 (sqlite3_stmt **)CONCAT44(uVar6,iVar3),in_stack_ffffffffffffffa0);
      sqlite3_free((void *)0x13af36);
    }
    if (iVar7 == 0) {
      *(char *)(in_RDI + 0xc4) = (char)iVar3;
      *(byte *)(in_RDI + 0xc6) = *(byte *)(in_RDI + 0xc6) & 0xfb | 4;
      iVar7 = sqlite3_step(in_R8);
      *(byte *)(in_RDI + 0xc6) = *(byte *)(in_RDI + 0xc6) & 0xfb;
      if (iVar7 == 0x65) {
        pMVar4 = memdbFromDbSchema(db_01,zSchema_00);
        if (pMVar4 == (MemFile *)0x0) {
          iVar7 = 1;
        }
        else {
          pMVar2 = pMVar4->pStore;
          pMVar2->aData = in_RDX;
          local_28 = (uchar *)0x0;
          pMVar2->sz = in_RCX;
          pMVar2->szAlloc = (sqlite3_int64)in_R8;
          pMVar2->szMax = (sqlite3_int64)in_R8;
          if (pMVar2->szMax < sqlite3Config.mxMemdbSize) {
            pMVar2->szMax = sqlite3Config.mxMemdbSize;
          }
          pMVar2->mFlags = in_R9D;
          iVar7 = 0;
        }
      }
      else {
        iVar7 = 1;
      }
    }
  }
  sqlite3_finalize((sqlite3_stmt *)CONCAT44(iVar7,iVar3));
  if ((local_28 != (uchar *)0x0) && ((in_R9D & 1) != 0)) {
    sqlite3_free((void *)0x13b07a);
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x13b088);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_deserialize(
  sqlite3 *db,            /* The database connection */
  const char *zSchema,    /* Which DB to reopen with the deserialization */
  unsigned char *pData,   /* The serialized database content */
  sqlite3_int64 szDb,     /* Number bytes in the deserialization */
  sqlite3_int64 szBuf,    /* Total size of buffer pData[] */
  unsigned mFlags         /* Zero or more SQLITE_DESERIALIZE_* flags */
){
  MemFile *p;
  char *zSql;
  sqlite3_stmt *pStmt = 0;
  int rc;
  int iDb;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( szDb<0 ) return SQLITE_MISUSE_BKPT;
  if( szBuf<0 ) return SQLITE_MISUSE_BKPT;
#endif

  sqlite3_mutex_enter(db->mutex);
  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  iDb = sqlite3FindDbName(db, zSchema);
  testcase( iDb==1 );
  if( iDb<2 && iDb!=0 ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  zSql = sqlite3_mprintf("ATTACH x AS %Q", zSchema);
  if( zSql==0 ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
    sqlite3_free(zSql);
  }
  if( rc ) goto end_deserialize;
  db->init.iDb = (u8)iDb;
  db->init.reopenMemdb = 1;
  rc = sqlite3_step(pStmt);
  db->init.reopenMemdb = 0;
  if( rc!=SQLITE_DONE ){
    rc = SQLITE_ERROR;
    goto end_deserialize;
  }
  p = memdbFromDbSchema(db, zSchema);
  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    MemStore *pStore = p->pStore;
    pStore->aData = pData;
    pData = 0;
    pStore->sz = szDb;
    pStore->szAlloc = szBuf;
    pStore->szMax = szBuf;
    if( pStore->szMax<sqlite3GlobalConfig.mxMemdbSize ){
      pStore->szMax = sqlite3GlobalConfig.mxMemdbSize;
    }
    pStore->mFlags = mFlags;
    rc = SQLITE_OK;
  }

end_deserialize:
  sqlite3_finalize(pStmt);
  if( pData && (mFlags & SQLITE_DESERIALIZE_FREEONCLOSE)!=0 ){
    sqlite3_free(pData);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}